

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cc
# Opt level: O0

InputGraph
anon_unknown.dwarf_188d0d::read_csv
          (istream *infile,string *filename,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *rename_map)

{
  string_view l_00;
  string_view label_00;
  string_view label_01;
  string_view label_02;
  string_view l_01;
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  istream *piVar4;
  undefined8 uVar5;
  pointer ppVar6;
  type_conflict3 *ptVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  istream *in_RSI;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar9;
  type_conflict3 *l_2;
  type *v_1;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  type_conflict3 *l_1;
  type *v;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range1_1;
  anon_class_16_2_68564ce5 rename;
  type *l;
  type_conflict3 *t;
  type_conflict3 *f;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int right_idx;
  int left_idx;
  size_type pos2;
  char delim;
  string label;
  string right;
  string left;
  size_type pos;
  string line;
  bool seen_directed_edge;
  bool seen_edge_label;
  bool seen_vertex_label;
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  edges;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertex_labels;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertices;
  InputGraph *result;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  mapped_type *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  type_conflict3 in_stack_fffffffffffffb9c;
  __tuple_element_t<1UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffba0;
  __tuple_element_t<0UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffba4;
  __tuple_element_t<0UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffba8;
  __tuple_element_t<1UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffbac;
  __tuple_element_t<0UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffbb0;
  __tuple_element_t<1UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  in_stack_fffffffffffffbb4;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  undefined2 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbda;
  undefined4 in_stack_fffffffffffffbdb;
  undefined1 in_stack_fffffffffffffbdf;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  string *in_stack_fffffffffffffc10;
  anon_class_16_2_68564ce5 *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc28;
  InputGraph *in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_368;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_360;
  string *local_358;
  __sv_type local_330;
  type_conflict3 *local_320;
  type *local_318;
  reference local_310;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_308;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_300;
  string *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  __sv_type local_2e0;
  __sv_type local_2d0;
  __sv_type local_2c0;
  __tuple_element_t<2UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *local_2b0;
  __tuple_element_t<1UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *local_2a8;
  __tuple_element_t<0UL,_tuple<int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *local_2a0;
  reference local_298;
  tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_290;
  __normal_iterator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_288;
  undefined1 *local_280;
  undefined1 local_271;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_270;
  undefined1 local_268;
  size_type local_260;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_258;
  undefined1 local_250;
  int local_244;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_240;
  undefined1 local_238;
  size_type local_230;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_228;
  undefined1 local_220;
  int local_214;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_210;
  undefined1 local_208;
  size_type local_200;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1f8;
  undefined1 local_1f0;
  string local_1c8;
  size_type local_1a8;
  value_type local_199;
  undefined1 local_132;
  size_type local_110;
  string local_108 [37];
  byte local_e3;
  byte local_e2;
  byte local_e1;
  undefined1 local_e0 [80];
  string local_90;
  undefined1 local_55;
  undefined8 local_20;
  undefined8 local_18;
  istream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = std::ios::operator!((ios *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)));
  if ((uVar3 & 1) != 0) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8._M_cur,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    GraphFileError::GraphFileError
              ((GraphFileError *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8,(string *)in_stack_fffffffffffffbe0._M_cur,
               (bool)in_stack_fffffffffffffbdf);
    local_55 = 0;
    __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x1b35da);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1b35e7);
  std::
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1b35f4);
  local_e1 = 0;
  local_e2 = 0;
  local_e3 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_108);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!(bool)uVar1) {
      local_271 = 0;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)0x1b3c5b);
      InputGraph::InputGraph
                ((InputGraph *)in_stack_fffffffffffffbe0._M_cur,
                 CONCAT13(in_stack_fffffffffffffbdf,(int3)((uint)in_stack_fffffffffffffbdb >> 8)),
                 SUB41(in_stack_fffffffffffffbdb,0),(bool)in_stack_fffffffffffffbda);
      local_280 = local_e0;
      local_288._M_current =
           (tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_290 = (tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      while (bVar2 = __gnu_cxx::
                     operator==<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ((__normal_iterator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffffb90,
                                (__normal_iterator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        local_298 = __gnu_cxx::
                    __normal_iterator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&local_288);
        local_2a0 = std::get<0ul,int,int,std::__cxx11::string>
                              ((tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x1b3cfe);
        local_2a8 = std::get<1ul,int,int,std::__cxx11::string>
                              ((tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x1b3d13);
        local_2b0 = std::get<2ul,int,int,std::__cxx11::string>
                              ((tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x1b3d28);
        if ((local_e3 & 1) == 0) {
          if ((local_e2 & 1) == 0) {
            InputGraph::add_edge
                      ((InputGraph *)in_stack_fffffffffffffbd0,
                       (int)((ulong)in_stack_fffffffffffffbc8._M_cur >> 0x20),
                       (int)in_stack_fffffffffffffbc8._M_cur);
          }
          else {
            in_stack_fffffffffffffba8 = *local_2a0;
            in_stack_fffffffffffffbac = *local_2a8;
            local_2d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  (in_stack_fffffffffffffb90);
            label_01._M_str._0_7_ = in_stack_fffffffffffffbf0;
            label_01._M_len = (size_t)in_stack_fffffffffffffbe8;
            label_01._M_str._7_1_ = in_stack_fffffffffffffbf7;
            InputGraph::add_directed_edge
                      ((InputGraph *)in_stack_fffffffffffffbe0._M_cur,
                       CONCAT13(in_stack_fffffffffffffbdf,
                                (int3)((uint)in_stack_fffffffffffffbdb >> 8)),
                       CONCAT13((char)in_stack_fffffffffffffbdb,
                                CONCAT12(in_stack_fffffffffffffbda,in_stack_fffffffffffffbd8)),
                       label_01);
            in_stack_fffffffffffffba0 = *local_2a8;
            in_stack_fffffffffffffba4 = *local_2a0;
            local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  (in_stack_fffffffffffffb90);
            label_02._M_str._0_7_ = in_stack_fffffffffffffbf0;
            label_02._M_len = (size_t)in_stack_fffffffffffffbe8;
            label_02._M_str._7_1_ = in_stack_fffffffffffffbf7;
            InputGraph::add_directed_edge
                      ((InputGraph *)in_stack_fffffffffffffbe0._M_cur,
                       CONCAT13(in_stack_fffffffffffffbdf,
                                (int3)((uint)in_stack_fffffffffffffbdb >> 8)),
                       CONCAT13((char)in_stack_fffffffffffffbdb,
                                CONCAT12(in_stack_fffffffffffffbda,in_stack_fffffffffffffbd8)),
                       label_02);
          }
        }
        else {
          in_stack_fffffffffffffbb0 = *local_2a0;
          in_stack_fffffffffffffbb4 = *local_2a8;
          local_2c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffb90);
          label_00._M_str._0_7_ = in_stack_fffffffffffffbf0;
          label_00._M_len = (size_t)in_stack_fffffffffffffbe8;
          label_00._M_str._7_1_ = in_stack_fffffffffffffbf7;
          InputGraph::add_directed_edge
                    ((InputGraph *)in_stack_fffffffffffffbe0._M_cur,
                     CONCAT13(in_stack_fffffffffffffbdf,(int3)((uint)in_stack_fffffffffffffbdb >> 8)
                             ),
                     CONCAT13((char)in_stack_fffffffffffffbdb,
                              CONCAT12(in_stack_fffffffffffffbda,in_stack_fffffffffffffbd8)),
                     label_00);
        }
        __gnu_cxx::
        __normal_iterator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_288);
      }
      local_2f0 = local_20;
      local_2e8 = local_18;
      local_2f8 = &local_90;
      local_300._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_308._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      while (bVar2 = std::__detail::operator==(&local_300,&local_308), ((bVar2 ^ 0xffU) & 1) != 0) {
        local_310 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 *)0x1b3f60);
        local_318 = std::get<0ul,std::__cxx11::string_const,int>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                *)0x1b3f75);
        local_320 = std::get<1ul,std::__cxx11::string_const,int>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                *)0x1b3f8a);
        in_stack_fffffffffffffb9c = *local_320;
        (anonymous_namespace)::
        read_csv(std::istream&&,std::__cxx11::string_const&,std::optional<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>const&)
        ::$_0::operator()::string_const___const(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10)
        ;
        local_330 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffb90);
        l_01._M_len._7_1_ = uVar1;
        l_01._M_len._0_7_ = in_stack_fffffffffffffc38;
        l_01._M_str = (char *)piVar4;
        InputGraph::set_vertex_name
                  (in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),l_01);
        std::__cxx11::string::~string(in_stack_fffffffffffffb90);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                      *)in_stack_fffffffffffffb90);
      }
      if ((local_e1 & 1) != 0) {
        local_358 = &local_90;
        local_360._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_368._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        while (bVar2 = std::__detail::operator==(&local_360,&local_368), ((bVar2 ^ 0xffU) & 1) != 0)
        {
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
          ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                       *)0x1b40b9);
          std::get<0ul,std::__cxx11::string_const,int>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)0x1b40ce);
          ptVar7 = std::get<1ul,std::__cxx11::string_const,int>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                               *)0x1b40e3);
          in_stack_fffffffffffffb90 =
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb90,
                            (key_type *)CONCAT44(*ptVar7,in_stack_fffffffffffffb88));
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb90);
          l_00._M_len._4_4_ = in_stack_fffffffffffffbac;
          l_00._M_len._0_4_ = in_stack_fffffffffffffba8;
          l_00._M_str._0_4_ = in_stack_fffffffffffffbb0;
          l_00._M_str._4_4_ = in_stack_fffffffffffffbb4;
          InputGraph::set_vertex_label
                    ((InputGraph *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb9c,l_00);
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
          ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                        *)in_stack_fffffffffffffb90);
        }
      }
      local_271 = 1;
      std::__cxx11::string::~string(in_stack_fffffffffffffb90);
      std::
      vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x1b41ae);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)0x1b41bb);
      return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
             super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
             super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
    }
    local_110 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                              (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                              CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    if (local_110 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    in_stack_fffffffffffffc18 =
         (anon_class_16_2_68564ce5 *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                    CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    local_199 = *(value_type *)&in_stack_fffffffffffffc18->rename_map;
    local_1a8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_fffffffffffffbd0,
                     (char)((ulong)in_stack_fffffffffffffbc8._M_cur >> 0x38),
                     CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    if (local_1a8 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      in_stack_fffffffffffffc10 = &local_1c8;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbe0._M_cur,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbdf,
                          CONCAT43(in_stack_fffffffffffffbdb,
                                   CONCAT12(in_stack_fffffffffffffbda,in_stack_fffffffffffffbd8))));
      std::__cxx11::string::~string(in_stack_fffffffffffffb90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbe0._M_cur,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbdf,
                          CONCAT43(in_stack_fffffffffffffbdb,
                                   CONCAT12(in_stack_fffffffffffffbda,in_stack_fffffffffffffbd8))));
      std::__cxx11::string::~string(in_stack_fffffffffffffb90);
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b396e
                      );
    if ((!bVar2) ||
       (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b3984)
       , bVar2)) {
      in_stack_fffffffffffffbd0 = &local_90;
      local_230 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)0x1b3a59);
      pVar9 = std::
              unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::emplace<std::__cxx11::string&,unsigned_long>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (unsigned_long *)in_stack_fffffffffffffb90);
      in_stack_fffffffffffffbe0._M_cur =
           (__node_type *)
           pVar9.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur;
      in_stack_fffffffffffffbdf = pVar9.second;
      local_240._M_cur = in_stack_fffffffffffffbe0._M_cur;
      local_238 = in_stack_fffffffffffffbdf;
      local_228._M_cur = in_stack_fffffffffffffbe0._M_cur;
      local_220 = in_stack_fffffffffffffbdf;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x1b3ac9);
      local_214 = ppVar6->second;
      local_260 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)0x1b3ae5);
      pVar9 = std::
              unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::emplace<std::__cxx11::string&,unsigned_long>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (unsigned_long *)in_stack_fffffffffffffb90);
      in_stack_fffffffffffffbc8._M_cur =
           (__node_type *)
           pVar9.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur;
      in_stack_fffffffffffffbc7 = pVar9.second;
      local_270._M_cur = in_stack_fffffffffffffbc8._M_cur;
      local_268 = in_stack_fffffffffffffbc7;
      local_258._M_cur = in_stack_fffffffffffffbc8._M_cur;
      local_250 = in_stack_fffffffffffffbc7;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x1b3b55);
      local_244 = ppVar6->second;
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1b3b6c);
      if (!bVar2) {
        local_e2 = 1;
      }
      if (local_199 == '>') {
        local_e3 = 1;
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (int *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      }
      else {
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (int *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (int *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      }
    }
    else {
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1b3999);
      if (!bVar2) {
        local_e1 = 1;
        pVar8 = std::
                unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                          ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                           in_stack_fffffffffffffb90);
        local_1f8._M_cur =
             (__node_type *)
             pVar8.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur;
        local_1f0 = pVar8.second;
      }
      in_stack_fffffffffffffbe8 = &local_90;
      local_200 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)0x1b39fd);
      pVar9 = std::
              unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::emplace<std::__cxx11::string&,unsigned_long>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (unsigned_long *)in_stack_fffffffffffffb90);
      local_210._M_cur =
           (__node_type *)
           pVar9.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur;
      in_stack_fffffffffffffbf7 = pVar9.second;
      local_208 = in_stack_fffffffffffffbf7;
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffb90);
    std::__cxx11::string::~string(in_stack_fffffffffffffb90);
    std::__cxx11::string::~string(in_stack_fffffffffffffb90);
  }
  local_132 = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8._M_cur,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
  GraphFileError::GraphFileError
            ((GraphFileError *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8,(string *)in_stack_fffffffffffffbe0._M_cur,
             (bool)in_stack_fffffffffffffbdf);
  local_132 = 0;
  __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_csv(istream && infile, const string & filename, const optional<unordered_map<string, string>> & rename_map) -> InputGraph
    {
        if (! infile)
            throw GraphFileError{filename, "error opening file", false};

        unordered_map<string, int> vertices;
        unordered_map<string, string> vertex_labels;
        vector<tuple<int, int, string>> edges;
        bool seen_vertex_label = false, seen_edge_label = false, seen_directed_edge = false;

        string line;

        while (getline(infile, line)) {
            auto pos = line.find_first_of(",>");
            if (string::npos == pos)
                throw GraphFileError{filename, "expected a comma but didn't get one", true};

            string left = line.substr(0, pos), right = line.substr(pos + 1), label;
            char delim = line.at(pos);

            auto pos2 = right.find(',');
            if (string::npos != pos2) {
                label = right.substr(pos2 + 1);
                right = right.substr(0, pos2);
            }

            if (right.empty() && ! left.empty()) {
                if (! label.empty()) {
                    seen_vertex_label = true;
                    vertex_labels.emplace(left, label);
                }

                vertices.emplace(left, vertices.size());
            }
            else {
                int left_idx = vertices.emplace(left, vertices.size()).first->second;
                int right_idx = vertices.emplace(right, vertices.size()).first->second;

                if (! label.empty())
                    seen_edge_label = true;

                if (delim == '>') {
                    seen_directed_edge = true;
                    edges.emplace_back(left_idx, right_idx, label);
                }
                else {
                    edges.emplace_back(left_idx, right_idx, label);
                    edges.emplace_back(right_idx, left_idx, label);
                }
            }
        }

        InputGraph result{int(vertices.size()), seen_vertex_label, seen_edge_label};

        for (auto & [f, t, l] : edges)
            if (seen_directed_edge)
                result.add_directed_edge(f, t, l);
            else if (seen_edge_label) {
                result.add_directed_edge(f, t, l);
                result.add_directed_edge(t, f, l);
            }
            else
                result.add_edge(f, t);

        auto rename = [&](const string & s) -> string {
            if (rename_map) {
                auto r = rename_map->find(s);
                if (r == rename_map->end())
                    throw GraphFileError{filename, "did not find a name for vertex '" + s + "'", true};
                return r->second;
            }
            else
                return s;
        };

        for (auto & [v, l] : vertices)
            result.set_vertex_name(l, rename(v));

        if (seen_vertex_label)
            for (auto & [v, l] : vertices)
                result.set_vertex_label(l, vertex_labels[v]);

        return result;
    }